

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool FIX::Session::sendToTarget(Message *message,SessionID *sessionID)

{
  SessionNotFound *this;
  ssize_t sVar1;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  allocator<char> local_41;
  string local_40;
  Session *local_20;
  Session *pSession;
  SessionID *sessionID_local;
  Message *message_local;
  
  pSession = (Session *)sessionID;
  sessionID_local = (SessionID *)message;
  Message::setSessionID(message,sessionID);
  local_20 = lookupSession((SessionID *)pSession);
  if (local_20 == (Session *)0x0) {
    this = (SessionNotFound *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    SessionNotFound::SessionNotFound(this,&local_40);
    __cxa_throw(this,&SessionNotFound::typeinfo,SessionNotFound::~SessionNotFound);
  }
  sVar1 = send(local_20,(int)sessionID_local,__buf,in_RCX,in_R8D);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool Session::sendToTarget( Message& message, const SessionID& sessionID )
EXCEPT ( SessionNotFound )
{
  message.setSessionID( sessionID );
  Session* pSession = lookupSession( sessionID );
  if ( !pSession ) throw SessionNotFound();
  return pSession->send( message );
}